

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  string *output;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar3 = Consume(this,"import");
  if (!bVar3) {
    return false;
  }
  iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar4 == 0) {
    iVar4 = public_dependency->current_size_;
    LocationRecorder::Init(&local_40,root_location);
    LocationRecorder::AddPath(&local_40,10);
    LocationRecorder::AddPath(&local_40,iVar4);
    bVar3 = Consume(this,"public");
    if (!bVar3) {
LAB_0021a0fa:
      LocationRecorder::~LocationRecorder(&local_40);
      return false;
    }
    iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    if (public_dependency->current_size_ == public_dependency->total_size_) {
      RepeatedField<int>::Reserve(public_dependency,public_dependency->total_size_ + 1);
    }
    iVar2 = public_dependency->current_size_;
    public_dependency->current_size_ = iVar2 + 1;
    public_dependency->elements_[iVar2] = iVar4;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 != 0) goto LAB_0021a0b3;
    iVar4 = weak_dependency->current_size_;
    LocationRecorder::Init(&local_40,root_location);
    LocationRecorder::AddPath(&local_40,0xb);
    LocationRecorder::AddPath(&local_40,iVar4);
    bVar3 = Consume(this,"weak");
    if (!bVar3) goto LAB_0021a0fa;
    iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    if (weak_dependency->current_size_ == weak_dependency->total_size_) {
      RepeatedField<int>::Reserve(weak_dependency,weak_dependency->total_size_ + 1);
    }
    iVar2 = weak_dependency->current_size_;
    weak_dependency->current_size_ = iVar2 + 1;
    weak_dependency->elements_[iVar2] = iVar4;
  }
  LocationRecorder::~LocationRecorder(&local_40);
  if (bVar3 == false) {
    return false;
  }
LAB_0021a0b3:
  iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
  LocationRecorder::Init(&local_40,root_location);
  LocationRecorder::AddPath(&local_40,3);
  LocationRecorder::AddPath(&local_40,iVar4);
  iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
  iVar2 = (dependency->super_RepeatedPtrFieldBase).allocated_size_;
  if (iVar4 < iVar2) {
    (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
    output = (string *)(dependency->super_RepeatedPtrFieldBase).elements_[iVar4];
  }
  else {
    iVar4 = (dependency->super_RepeatedPtrFieldBase).total_size_;
    if (iVar2 == iVar4) {
      internal::RepeatedPtrFieldBase::Reserve(&dependency->super_RepeatedPtrFieldBase,iVar4 + 1);
    }
    piVar1 = &(dependency->super_RepeatedPtrFieldBase).allocated_size_;
    *piVar1 = *piVar1 + 1;
    output = internal::StringTypeHandlerBase::New_abi_cxx11_();
    iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
    (dependency->super_RepeatedPtrFieldBase).elements_[iVar4] = output;
  }
  bVar3 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar3) {
    LocationRecorder::EndAt(&local_40,&this->input_->previous_);
    bVar3 = ConsumeEndOfDeclaration(this,";",&local_40);
  }
  else {
    bVar3 = false;
  }
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar3;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}